

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend_openssl.cpp
# Opt level: O2

QString * QTlsBackendOpenSSL::getErrorsFromOpenSsl(void)

{
  long lVar1;
  unsigned_long e;
  QString *in_RDI;
  long in_FS_OFFSET;
  char buf [256];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = (char16_t *)0x0;
  (in_RDI->d).size = 0;
  memset(buf,0,0x100);
  while( true ) {
    e = q_ERR_get_error();
    if (e == 0) break;
    if ((in_RDI->d).size != 0) {
      QString::append((QLatin1String *)in_RDI);
    }
    q_ERR_error_string_n(e,buf,0x100);
    QtPrivate::lengthHelperPointer<char>(buf);
    QString::append((QLatin1String *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QTlsBackendOpenSSL::getErrorsFromOpenSsl()
{
    QString errorString;
    char buf[256] = {}; // OpenSSL docs claim both 120 and 256; use the larger.
    unsigned long errNum;
    while ((errNum = q_ERR_get_error())) {
        if (!errorString.isEmpty())
            errorString.append(", "_L1);
        q_ERR_error_string_n(errNum, buf, sizeof buf);
        errorString.append(QLatin1StringView(buf)); // error is ascii according to man ERR_error_string
    }
    return errorString;
}